

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Date.cc
# Opt level: O2

YearMonthDay muduo::detail::getYearMonthDay(int julianDayNumber)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  YearMonthDay YVar6;
  
  iVar1 = (julianDayNumber * 4 + 0x1f4b3) / 0x23ab1;
  iVar5 = (iVar1 * 0x23ab1) / -4 + julianDayNumber + 0x7d2c;
  iVar2 = (iVar5 * 4 + 3) / 0x5b5;
  iVar5 = (iVar2 * 0x5b5) / -4 + iVar5;
  iVar4 = iVar5 * 5 + 2;
  iVar3 = iVar4 / 0x99;
  iVar4 = iVar4 / 0x5fa;
  YVar6.year = iVar4 + iVar1 * 100 + iVar2 + -0x12c0;
  YVar6.month = iVar4 * -0xc + iVar3 + 3;
  YVar6.day = iVar5 + (iVar3 * 0x99 + 2) / -5 + 1;
  return YVar6;
}

Assistant:

struct Date::YearMonthDay getYearMonthDay(int julianDayNumber)
{
  int a = julianDayNumber + 32044;
  int b = (4 * a + 3) / 146097;
  int c = a - ((b * 146097) / 4);
  int d = (4 * c + 3) / 1461;
  int e = c - ((1461 * d) / 4);
  int m = (5 * e + 2) / 153;
  Date::YearMonthDay ymd;
  ymd.day = e - ((153 * m + 2) / 5) + 1;
  ymd.month = m + 3 - 12 * (m / 10);
  ymd.year = b * 100 + d - 4800 + (m / 10);
  return ymd;
}